

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O3

void __thiscall test_adjacency_graph_at_Test::TestBody(test_adjacency_graph_at_Test *this)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  undefined1 auVar6 [8];
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  span<unsigned_long,_18446744073709551615UL> sVar7;
  DeathTest *gtest_dt;
  Adjacency_Graph<true> graph;
  AssertHelper local_d8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  undefined1 local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  Adjacency_Graph<false> local_88 [48];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_40;
  
  local_c8 = (undefined1  [8])0x0;
  local_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_b8._0_1_ = true;
  local_b8._1_7_ = 0;
  local_b0 = 1;
  local_a8 = 2;
  local_a0 = 3;
  local_98 = 3;
  local_90 = 0;
  edge_graph._M_len = 4;
  edge_graph._M_array = (iterator)local_c8;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(local_88,edge_graph);
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sVar7 = Disa::Adjacency_Graph<false>::operator[](local_88,(size_t *)&local_d0);
  local_d8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_c8,"graph[0][0]","1",sVar7._M_ptr,(int *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi
                );
  }
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sVar7 = Disa::Adjacency_Graph<false>::operator[](local_88,(size_t *)&local_d0);
  local_d8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_c8,"graph[0][1]","3",sVar7._M_ptr + 1,(int *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi
                );
  }
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  sVar7 = Disa::Adjacency_Graph<false>::operator[](local_88,(size_t *)&local_d0);
  local_d8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_c8,"graph[1][0]","0",sVar7._M_ptr,(int *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi
                );
  }
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  sVar7 = Disa::Adjacency_Graph<false>::operator[](local_88,(size_t *)&local_d0);
  local_d8.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_c8,"graph[1][1]","2",sVar7._M_ptr + 1,(int *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi
                );
  }
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  sVar7 = Disa::Adjacency_Graph<false>::operator[](local_88,(size_t *)&local_d0);
  local_d8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_c8,"graph[2][0]","1",sVar7._M_ptr,(int *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi
                );
  }
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  sVar7 = Disa::Adjacency_Graph<false>::operator[](local_88,(size_t *)&local_d0);
  local_d8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_c8,"graph[2][1]","3",sVar7._M_ptr + 1,(int *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi
                );
  }
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  sVar7 = Disa::Adjacency_Graph<false>::operator[](local_88,(size_t *)&local_d0);
  local_d8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_c8,"graph[3][0]","0",sVar7._M_ptr,(int *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x60,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi
                );
  }
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  sVar7 = Disa::Adjacency_Graph<false>::operator[](local_88,(size_t *)&local_d0);
  local_d8.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_c8,"graph[3][1]","2",sVar7._M_ptr + 1,(int *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x61,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi
                );
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_d0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x158308;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_c8,
               (testing *)&local_d0,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_40,(PolymorphicMatcher *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("auto test_0 = graph[-1]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
                       ,99,(DeathTest **)&local_d8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_40);
    if (!bVar2) goto LAB_0010f888;
    auVar6 = (undefined1  [8])CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
    if (auVar6 != (undefined1  [8])0x0) {
      iVar4 = (**(code **)(((element_type *)auVar6)->pattern_ + 0x10))(auVar6);
      if (iVar4 == 0) {
        plVar1 = (long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
        iVar4 = (**(code **)(*plVar1 + 0x18))(plVar1);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*plVar1 + 0x20))(plVar1,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(((element_type *)auVar6)->pattern_ + 8))(auVar6);
          goto LAB_0010f888;
        }
      }
      else if (iVar4 == 1) {
        plVar1 = (long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          local_c8 = (undefined1  [8])0xffffffffffffffff;
          Disa::Adjacency_Graph<false>::operator[](local_88,(size_t *)local_c8);
        }
        (**(code **)(*(long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) + 0x28))
                  ((long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_),2);
        (**(code **)(*plVar1 + 0x28))(plVar1,0);
      }
      pcVar5 = ((element_type *)auVar6)->pattern_;
      goto LAB_0010f8db;
    }
  }
  else {
LAB_0010f888:
    testing::Message::Message((Message *)local_c8);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,99,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_c8 != (undefined1  [8])0x0) {
      pcVar5 = *(char **)local_c8;
      auVar6 = local_c8;
LAB_0010f8db:
      (**(code **)(pcVar5 + 8))(auVar6);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_d0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x158308;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_c8,
               (testing *)&local_d0,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_58,(PolymorphicMatcher *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("auto test_1 = graph[4]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_58,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
                       ,100,(DeathTest **)&local_d8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_58);
    if (!bVar2) goto LAB_0010f9f2;
    auVar6 = (undefined1  [8])CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
    if (auVar6 == (undefined1  [8])0x0) goto LAB_0010fa48;
    iVar4 = (**(code **)(((element_type *)auVar6)->pattern_ + 0x10))(auVar6);
    if (iVar4 == 0) {
      plVar1 = (long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
      iVar4 = (**(code **)(*plVar1 + 0x18))(plVar1);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
      cVar3 = (**(code **)(*plVar1 + 0x20))(plVar1,bVar2);
      if (cVar3 == '\0') {
        (**(code **)(((element_type *)auVar6)->pattern_ + 8))(auVar6);
        goto LAB_0010f9f2;
      }
    }
    else if (iVar4 == 1) {
      plVar1 = (long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        local_c8 = (undefined1  [8])&DAT_00000004;
        Disa::Adjacency_Graph<false>::operator[](local_88,(size_t *)local_c8);
      }
      (**(code **)(*(long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) + 0x28))
                ((long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_),2);
      (**(code **)(*plVar1 + 0x28))(plVar1,0);
    }
    pcVar5 = ((element_type *)auVar6)->pattern_;
  }
  else {
LAB_0010f9f2:
    testing::Message::Message((Message *)local_c8);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,100,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_c8 == (undefined1  [8])0x0) goto LAB_0010fa48;
    pcVar5 = *(char **)local_c8;
    auVar6 = local_c8;
  }
  (**(code **)(pcVar5 + 8))(auVar6);
LAB_0010fa48:
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(local_88);
  return;
}

Assistant:

TEST(test_adjacency_graph, at) {
  Adjacency_Graph<false> graph({{0, 1}, {2, 1}, {2, 3}, {3, 0}});  // place some edge backwards.

  EXPECT_EQ(graph[0][0], 1);
  EXPECT_EQ(graph[0][1], 3);
  EXPECT_EQ(graph[1][0], 0);
  EXPECT_EQ(graph[1][1], 2);
  EXPECT_EQ(graph[2][0], 1);
  EXPECT_EQ(graph[2][1], 3);
  EXPECT_EQ(graph[3][0], 0);
  EXPECT_EQ(graph[3][1], 2);

  EXPECT_DEATH(auto test_0 = graph[-1], "./*");
  EXPECT_DEATH(auto test_1 = graph[4], "./*");
}